

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall
UdpSocket::Implementation::Connect(Implementation *this,IpEndpointName *remoteEndpoint)

{
  int iVar1;
  runtime_error *this_00;
  uint uVar2;
  ushort uVar3;
  
  (this->connectedAddr_).sin_family = 0;
  (this->connectedAddr_).sin_port = 0;
  (this->connectedAddr_).sin_addr = 0;
  (this->connectedAddr_).sin_zero[0] = '\0';
  (this->connectedAddr_).sin_zero[1] = '\0';
  (this->connectedAddr_).sin_zero[2] = '\0';
  (this->connectedAddr_).sin_zero[3] = '\0';
  (this->connectedAddr_).sin_zero[4] = '\0';
  (this->connectedAddr_).sin_zero[5] = '\0';
  (this->connectedAddr_).sin_zero[6] = '\0';
  (this->connectedAddr_).sin_zero[7] = '\0';
  (this->connectedAddr_).sin_family = 2;
  uVar2 = (uint)remoteEndpoint->address;
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  if (remoteEndpoint->address == 0xffffffff) {
    uVar2 = 0;
  }
  (this->connectedAddr_).sin_addr.s_addr = uVar2;
  uVar3 = (ushort)remoteEndpoint->port;
  uVar3 = uVar3 << 8 | uVar3 >> 8;
  if (remoteEndpoint->port == -1) {
    uVar3 = 0;
  }
  (this->connectedAddr_).sin_port = uVar3;
  iVar1 = connect(this->socket_,(sockaddr *)&this->connectedAddr_,0x10);
  if (-1 < iVar1) {
    this->isConnected_ = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unable to connect udp socket\n");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Connect( const IpEndpointName& remoteEndpoint )
	{
		SockaddrFromIpEndpointName( connectedAddr_, remoteEndpoint );
       
        if (connect(socket_, (struct sockaddr *)&connectedAddr_, sizeof(connectedAddr_)) < 0) {
            throw std::runtime_error("unable to connect udp socket\n");
        }

		isConnected_ = true;
	}